

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O3

void hmac_free(ssh2_mac *mac)

{
  (**(code **)((mac[-3].binarysink_)->write + 0x20))();
  (**(code **)((mac[-2].vt)->new + 0x20))();
  (**(code **)((mac[-2].binarysink_)->write + 0x20))();
  smemclr(mac[-1].vt,(size_t)(mac[-3].vt)->text_name);
  safefree(mac[-1].vt);
  strbuf_free((strbuf *)mac[-1].binarysink_);
  smemclr(mac + -3,0x40);
  safefree(mac + -3);
  return;
}

Assistant:

static void hmac_free(ssh2_mac *mac)
{
    struct hmac *ctx = container_of(mac, struct hmac, mac);

    ssh_hash_free(ctx->h_outer);
    ssh_hash_free(ctx->h_inner);
    ssh_hash_free(ctx->h_live);
    smemclr(ctx->digest, ctx->hashalg->hlen);
    sfree(ctx->digest);
    strbuf_free(ctx->text_name);

    smemclr(ctx, sizeof(*ctx));
    sfree(ctx);
}